

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location,
          FileDescriptorProto *containing_file)

{
  Rep *pRVar1;
  bool bVar2;
  int iVar3;
  UninterpretedOption_NamePart *obj;
  void *pvVar4;
  string *psVar5;
  undefined8 *puVar6;
  string identifier;
  LocationRecorder location;
  string local_68;
  LocationRecorder local_48;
  
  pRVar1 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar1 == (Rep *)0x0) {
LAB_0033f505:
    obj = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
                    ((uninterpreted_option->name_).super_RepeatedPtrFieldBase.arena_);
    pvVar4 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                       (&(uninterpreted_option->name_).super_RepeatedPtrFieldBase,obj);
  }
  else {
    iVar3 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar1->allocated_size <= iVar3) goto LAB_0033f505;
    (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
    pvVar4 = pRVar1->elements[iVar3];
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar3 == 0) {
    bVar2 = Consume(this,"(");
    if (bVar2) {
      LocationRecorder::LocationRecorder(&local_48,part_location,1);
      if ((this->input_->current_).type == TYPE_IDENTIFIER) {
        bVar2 = ConsumeIdentifier(this,&local_68,"Expected identifier.");
        if (!bVar2) goto LAB_0033f6e9;
        *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
        puVar6 = (undefined8 *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffc);
        if ((*(ulong *)((long)pvVar4 + 8) & 1) != 0) {
          puVar6 = (undefined8 *)*puVar6;
        }
        psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                           ((ArenaStringPtr *)((long)pvVar4 + 0x18),puVar6);
        std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_68._M_dataplus._M_p);
      }
      while( true ) {
        iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar3 != 0) break;
        bVar2 = Consume(this,".");
        if (!bVar2) goto LAB_0033f6e9;
        *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
        puVar6 = (undefined8 *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffc);
        if ((*(ulong *)((long)pvVar4 + 8) & 1) != 0) {
          puVar6 = (undefined8 *)*puVar6;
        }
        psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                           ((ArenaStringPtr *)((long)pvVar4 + 0x18),puVar6);
        std::__cxx11::string::append((char *)psVar5);
        bVar2 = ConsumeIdentifier(this,&local_68,"Expected identifier.");
        if (!bVar2) goto LAB_0033f6e9;
        *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
        puVar6 = (undefined8 *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffc);
        if ((*(ulong *)((long)pvVar4 + 8) & 1) != 0) {
          puVar6 = (undefined8 *)*puVar6;
        }
        psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                           ((ArenaStringPtr *)((long)pvVar4 + 0x18),puVar6);
        std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_68._M_dataplus._M_p);
      }
      LocationRecorder::~LocationRecorder(&local_48);
      bVar2 = Consume(this,")");
      if (bVar2) {
        *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 2;
        *(undefined1 *)((long)pvVar4 + 0x20) = 1;
        goto LAB_0033f5bb;
      }
    }
  }
  else {
    LocationRecorder::LocationRecorder(&local_48,part_location,1);
    bVar2 = ConsumeIdentifier(this,&local_68,"Expected identifier.");
    if (bVar2) {
      *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
      puVar6 = (undefined8 *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar4 + 8) & 1) != 0) {
        puVar6 = (undefined8 *)*puVar6;
      }
      psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                         ((ArenaStringPtr *)((long)pvVar4 + 0x18),puVar6);
      std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_68._M_dataplus._M_p);
      *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 2;
      *(undefined1 *)((long)pvVar4 + 0x20) = 0;
      LocationRecorder::~LocationRecorder(&local_48);
LAB_0033f5bb:
      bVar2 = true;
      goto LAB_0033f6f5;
    }
LAB_0033f6e9:
    LocationRecorder::~LocationRecorder(&local_48);
  }
  bVar2 = false;
LAB_0033f6f5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location,
                                 const FileDescriptorProto* containing_file) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  std::string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {    // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}